

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManComputeCuts(Sbl_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  Vec_Wrd_t *pVVar7;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  word *pwVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  uint uVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong Entry;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong Entry_00;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  Vec_Wrd_t *pVVar27;
  word wVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong Entry_01;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong Entry_02;
  bool bVar39;
  timespec ts;
  long local_d0;
  long local_a0;
  timespec local_80;
  Gia_Obj_t *local_70;
  long local_68;
  long local_60;
  word *local_58;
  word *local_50;
  word *local_48;
  word *local_40;
  long local_38;
  
  iVar10 = clock_gettime(3,&local_80);
  if (iVar10 < 0) {
    local_a0 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    local_a0 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  iVar10 = p->vLeaves->nSize;
  if ((0x80 < iVar10) || (iVar14 = p->vAnds->nSize, p->nVars < iVar14)) {
    __assert_fail("Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x2e2,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  p->vCutsStart->nSize = 0;
  p->vCutsObj->nSize = 0;
  p->vCutsNum->nSize = 0;
  p->vCutsI1->nSize = 0;
  p->vCutsI2->nSize = 0;
  p->vCutsN1->nSize = 0;
  p->vCutsN2->nSize = 0;
  pVVar12 = p->vLeaves;
  if (0 < pVVar12->nSize) {
    uVar20 = 0;
    do {
      iVar17 = pVVar12->pArray[uVar20];
      if (((long)iVar17 < 0) || (p->pGia->nObjs <= iVar17)) goto LAB_007a5be3;
      pGVar5 = p->pGia->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p->vCutsStart,p->vCutsI1->nSize);
      Vec_IntPush(p->vCutsObj,-1);
      Vec_IntPush(p->vCutsNum,1);
      if (uVar20 < 0x40) {
        Vec_WrdPush(p->vCutsI1,1L << ((byte)uVar20 & 0x3f));
        pVVar27 = p->vCutsI2;
        wVar28 = 0;
      }
      else {
        Vec_WrdPush(p->vCutsI1,0);
        pVVar27 = p->vCutsI2;
        wVar28 = 1L << ((byte)uVar20 & 0x3f);
      }
      Vec_WrdPush(pVVar27,wVar28);
      Vec_WrdPush(p->vCutsN1,0);
      Vec_WrdPush(p->vCutsN2,0);
      pGVar5[iVar17].Value = (uint)uVar20;
      uVar20 = uVar20 + 1;
      pVVar12 = p->vLeaves;
    } while ((long)uVar20 < (long)pVVar12->nSize);
  }
  pVVar12 = p->vAnds;
  if (0 < pVVar12->nSize) {
    uVar20 = 0;
    do {
      iVar17 = pVVar12->pArray[uVar20];
      if (((long)iVar17 < 0) || (p->pGia->nObjs <= iVar17)) goto LAB_007a5be3;
      pGVar5 = p->pGia->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar5 = pGVar5 + iVar17;
      uVar11 = (uint)*(undefined8 *)pGVar5;
      if (((int)uVar11 < 0) || (uVar11 = uVar11 & 0x1fffffff, uVar11 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x301,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      uVar11 = pGVar5[-(ulong)uVar11].Value;
      uVar15 = (ulong)uVar11;
      if (uVar15 == 0xffffffff) {
        __assert_fail("~Gia_ObjFanin0(pObj)->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x302,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      uVar1 = pGVar5[-(ulong)((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff)].Value;
      uVar16 = (ulong)uVar1;
      if (uVar16 == 0xffffffff) {
        __assert_fail("~Gia_ObjFanin1(pObj)->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x303,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if ((int)uVar11 < 0) goto LAB_007a5c21;
      iVar17 = p->vCutsStart->nSize;
      if (((iVar17 <= (int)uVar11) || ((int)uVar1 < 0)) || (iVar17 <= (int)uVar1))
      goto LAB_007a5c21;
      iVar17 = p->vCutsNum->nSize;
      if ((iVar17 <= (int)uVar11) || (iVar17 <= (int)uVar1)) goto LAB_007a5c21;
      local_70 = pGVar5;
      if (uVar20 == 0x80) {
        __assert_fail("Obj >= 0 && Obj < 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x2ab,"void Sbl_ManComputeCutsOne(Sbl_Man_t *, int, int, int)");
      }
      local_40 = p->vCutsI1->pArray;
      local_48 = p->vCutsI2->pArray;
      local_50 = p->vCutsN1->pArray;
      local_58 = p->vCutsN2->pArray;
      piVar6 = p->vCutsStart->pArray;
      iVar17 = piVar6[uVar15];
      local_d0 = (long)iVar17;
      iVar2 = piVar6[uVar16];
      piVar6 = p->vCutsNum->pArray;
      iVar3 = piVar6[uVar15];
      iVar4 = piVar6[uVar16];
      p->vTempI1->nSize = 0;
      p->vTempI2->nSize = 0;
      p->vTempN1->nSize = 0;
      p->vTempN2->nSize = 0;
      if (0 < iVar3) {
        local_60 = (long)(iVar2 + iVar4);
        local_68 = (long)(iVar3 + iVar17);
        do {
          lVar18 = (long)iVar2;
          if (0 < iVar4) {
            do {
              if (6 < p->LutSize) {
                __assert_fail("LutSize <= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                              ,0x274,"int Sbl_CutIsFeasible(word, word, word, word, int)");
              }
              Entry_00 = local_40[lVar18] | local_40[local_d0];
              Entry = local_48[lVar18] | local_48[local_d0];
              Entry_01 = local_50[lVar18] | local_50[local_d0];
              Entry_02 = local_58[lVar18] | local_58[local_d0];
              uVar24 = Entry_00 - 1 & Entry_00;
              uVar15 = Entry - 1 & Entry;
              uVar29 = Entry_01 - 1 & Entry_01;
              uVar21 = uVar24 - 1 & uVar24;
              uVar37 = Entry_02 - 1 & Entry_02;
              uVar25 = uVar15 - 1 & uVar15;
              uVar33 = uVar29 - 1 & uVar29;
              uVar19 = uVar21 - 1 & uVar21;
              uVar35 = uVar37 - 1 & uVar37;
              uVar22 = uVar25 - 1 & uVar25;
              uVar38 = uVar33 - 1 & uVar33;
              uVar32 = uVar35 - 1 & uVar35;
              uVar16 = uVar19 - 1 & uVar19;
              uVar26 = uVar22 - 1 & uVar22;
              uVar30 = uVar38 - 1 & uVar38;
              uVar34 = uVar32 - 1 & uVar32;
              iVar17 = (uint)(uVar34 != 0) + (uint)(uVar30 != 0) +
                       (uint)(uVar26 != 0) +
                       (uint)(uVar33 != 0) +
                       (uint)(uVar19 != 0) +
                       (uint)(uVar29 != 0) +
                       (uint)(uVar21 != 0) +
                       (uint)(Entry != 0) + (uint)(Entry_00 != 0) + (uint)(uVar24 != 0) +
                       (uint)(Entry_01 != 0) + (uint)(uVar15 != 0) + (uint)(Entry_02 != 0) +
                       (uint)(uVar25 != 0) + (uint)(uVar37 != 0) + (uint)(uVar22 != 0) +
                       (uint)(uVar16 != 0) + (uint)(uVar35 != 0) + (uint)(uVar38 != 0) +
                       (uint)(uVar32 != 0);
              if (p->LutSize < 5) {
                bVar39 = SBORROW4(iVar17,5);
                iVar17 = iVar17 + -5;
              }
              else {
                uVar16 = uVar16 - 1 & uVar16;
                uVar26 = uVar26 - 1 & uVar26;
                uVar30 = uVar30 - 1 & uVar30;
                uVar34 = uVar34 - 1 & uVar34;
                iVar17 = (((((((((uint)((uVar16 & uVar16 - 1) != 0) - (uint)(uVar16 == 0)) -
                               (uint)(uVar26 == 0)) - (uint)((uVar26 - 1 & uVar26) == 0)) -
                             (uint)(uVar30 == 0)) - (uint)((uVar30 - 1 & uVar30) == 0)) -
                           (uint)(uVar34 == 0)) + 7) - (uint)((uVar34 - 1 & uVar34) == 0)) + iVar17;
                bVar39 = SBORROW4(iVar17,7);
                iVar17 = iVar17 + -7;
              }
              local_38 = lVar18;
              if (bVar39 != iVar17 < 0) {
                pVVar27 = p->vTempI1;
                pVVar7 = p->vTempN1;
                uVar11 = pVVar27->nSize;
                uVar1 = pVVar7->nSize;
                if (uVar11 != uVar1) {
                  __assert_fail("vCutsI1->nSize == vCutsN1->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                ,0x282,
                                "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                               );
                }
                p_00 = p->vTempI2;
                p_01 = p->vTempN2;
                iVar17 = p_00->nSize;
                iVar3 = p_01->nSize;
                if (iVar17 != iVar3) {
                  __assert_fail("vCutsI2->nSize == vCutsN2->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                ,0x283,
                                "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                               );
                }
                if ((int)uVar11 < 1) {
                  uVar31 = 0;
                }
                else {
                  pwVar8 = pVVar27->pArray;
                  uVar15 = 0;
                  do {
                    if ((((pwVar8[uVar15] & ~Entry_00) == 0) &&
                        ((p_00->pArray[uVar15] & ~Entry) == 0)) &&
                       (((pVVar7->pArray[uVar15] & ~Entry_01) == 0 &&
                        ((p_01->pArray[uVar15] & ~Entry_02) == 0)))) goto LAB_007a54dc;
                    uVar15 = uVar15 + 1;
                  } while (uVar11 != uVar15);
                  uVar15 = 0;
                  uVar31 = 0;
                  do {
                    if (((((Entry_00 & ~pwVar8[uVar15]) != 0) ||
                         ((Entry & ~p_00->pArray[uVar15]) != 0)) ||
                        ((Entry_01 & ~pVVar7->pArray[uVar15]) != 0)) ||
                       ((Entry_02 & ~p_01->pArray[uVar15]) != 0)) {
                      if (uVar11 <= uVar31) {
LAB_007a5b48:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
                      }
                      pwVar8[uVar31] = pwVar8[uVar15];
                      if (((iVar17 <= (int)uVar31) ||
                          (p_00->pArray[uVar31] = p_00->pArray[uVar15], (int)uVar1 <= (int)uVar31))
                         || (pVVar7->pArray[uVar31] = pVVar7->pArray[uVar15], iVar3 <= (int)uVar31))
                      goto LAB_007a5b48;
                      p_01->pArray[uVar31] = p_01->pArray[uVar15];
                      uVar31 = uVar31 + 1;
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar11 != uVar15);
                }
                if ((((int)uVar11 < (int)uVar31) ||
                    (pVVar27->nSize = uVar31, p_00->nSize < (int)uVar31)) ||
                   ((p_00->nSize = uVar31, pVVar7->nSize < (int)uVar31 ||
                    (pVVar7->nSize = uVar31, p_01->nSize < (int)uVar31)))) {
                  __assert_fail("p->nSize >= nSizeNew",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
                }
                p_01->nSize = uVar31;
                Vec_WrdPush(pVVar27,Entry_00);
                Vec_WrdPush(p_00,Entry);
                Vec_WrdPush(pVVar7,Entry_01);
                Vec_WrdPush(p_01,Entry_02);
              }
LAB_007a54dc:
              lVar18 = local_38 + 1;
            } while (local_38 + 1 < local_60);
          }
          local_d0 = local_d0 + 1;
        } while (local_d0 < local_68);
      }
      Vec_IntPush(p->vCutsStart,p->vCutsI1->nSize);
      Vec_IntPush(p->vCutsNum,p->vTempI1->nSize + 1);
      pVVar27 = p->vTempI1;
      if (0 < pVVar27->nSize) {
        pVVar7 = p->vCutsI1;
        lVar18 = 0;
        do {
          Vec_WrdPush(pVVar7,pVVar27->pArray[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar27->nSize);
      }
      pVVar27 = p->vTempI2;
      if (0 < pVVar27->nSize) {
        pVVar7 = p->vCutsI2;
        lVar18 = 0;
        do {
          Vec_WrdPush(pVVar7,pVVar27->pArray[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar27->nSize);
      }
      pVVar27 = p->vTempN1;
      if (0 < pVVar27->nSize) {
        pVVar7 = p->vCutsN1;
        lVar18 = 0;
        do {
          Vec_WrdPush(pVVar7,pVVar27->pArray[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar27->nSize);
      }
      pVVar27 = p->vTempN2;
      if (0 < pVVar27->nSize) {
        pVVar7 = p->vCutsN2;
        lVar18 = 0;
        do {
          Vec_WrdPush(pVVar7,pVVar27->pArray[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar27->nSize);
      }
      Vec_WrdPush(p->vCutsI1,0);
      Vec_WrdPush(p->vCutsI2,0);
      if (uVar20 < 0x40) {
        Vec_WrdPush(p->vCutsN1,1L << ((byte)uVar20 & 0x3f));
        pVVar27 = p->vCutsN2;
        wVar28 = 0;
      }
      else {
        Vec_WrdPush(p->vCutsN1,0);
        pVVar27 = p->vCutsN2;
        wVar28 = 1L << ((byte)uVar20 & 0x3f);
      }
      Vec_WrdPush(pVVar27,wVar28);
      if (-1 < p->vTempI1->nSize) {
        iVar17 = -1;
        do {
          Vec_IntPush(p->vCutsObj,(int)uVar20);
          iVar17 = iVar17 + 1;
        } while (iVar17 < p->vTempI1->nSize);
      }
      local_70->Value = p->vLeaves->nSize + (int)uVar20;
      uVar20 = uVar20 + 1;
      pVVar12 = p->vAnds;
    } while ((long)uVar20 < (long)pVVar12->nSize);
  }
  iVar14 = iVar14 + iVar10;
  if (p->vCutsStart->nSize != iVar14) {
    __assert_fail("Vec_IntSize(p->vCutsStart) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x307,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (p->vCutsNum->nSize != iVar14) {
    __assert_fail("Vec_IntSize(p->vCutsNum) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x308,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar10 = p->vCutsI1->nSize;
  if (iVar10 != p->vCutsN1->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_WrdSize(p->vCutsN1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x309,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (p->vCutsI2->nSize != p->vCutsN2->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI2) == Vec_WrdSize(p->vCutsN2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  if (iVar10 != p->vCutsObj->nSize) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_IntSize(p->vCutsObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30b,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  p->vRootVars->nSize = 0;
  pVVar12 = p->vRoots;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar10 = pVVar12->pArray[lVar18];
      lVar13 = (long)iVar10;
      if ((lVar13 < 0) || (pGVar9 = p->pGia, pGVar9->nObjs <= iVar10)) goto LAB_007a5be3;
      if (pGVar9->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = pGVar9->pObjs + lVar13;
      if ((~*(uint *)pGVar5 & 0x9fffffff) != 0) {
        if (pGVar9->vMapping2->nSize <= iVar10) goto LAB_007a5c02;
        if (pGVar9->vMapping2->pArray[lVar13].nSize == 0) {
          __assert_fail("Gia_ObjIsLut2(p->pGia, Obj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                        ,0x313,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
        }
        uVar11 = pGVar5->Value;
        if (uVar11 == 0xffffffff) {
          __assert_fail("~pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                        ,0x314,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
        }
        Vec_IntPush(p->vRootVars,uVar11 - p->vLeaves->nSize);
      }
      lVar18 = lVar18 + 1;
      pVVar12 = p->vRoots;
    } while (lVar18 < pVVar12->nSize);
  }
  p->vPolar->nSize = 0;
  p->vSolInit->nSize = 0;
  pVVar12 = p->vAnds;
  uVar11 = pVVar12->nSize;
  uVar20 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    lVar18 = 0;
    do {
      uVar11 = (uint)uVar20;
      iVar10 = pVVar12->pArray[lVar18];
      lVar13 = (long)iVar10;
      if ((lVar13 < 0) || (pGVar9 = p->pGia, pGVar9->nObjs <= iVar10)) goto LAB_007a5be3;
      if (pGVar9->pObjs == (Gia_Obj_t *)0x0) break;
      if (pGVar9->vMapping2->nSize <= iVar10) goto LAB_007a5c02;
      if (pGVar9->vMapping2->pArray[lVar13].nSize != 0) {
        iVar14 = (int)lVar18;
        if (pGVar9->pObjs[lVar13].Value != p->vLeaves->nSize + iVar14) {
          __assert_fail("(int)pObj->Value == Vec_IntSize(p->vLeaves) + i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                        ,800,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
        }
        Vec_IntPush(p->vPolar,iVar14);
        Vec_IntPush(p->vSolInit,iVar14);
        pGVar9 = p->pGia;
        iVar17 = pGVar9->vMapping2->nSize;
        if (iVar17 <= iVar10) {
LAB_007a5c02:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar12 = pGVar9->vMapping2->pArray;
        if ((long)pVVar12[lVar13].nSize < 1) {
          wVar28 = 0;
          uVar16 = 0;
          uVar15 = 0;
          uVar20 = 0;
        }
        else {
          lVar23 = 0;
          uVar20 = 0;
          uVar15 = 0;
          uVar16 = 0;
          wVar28 = 0;
          do {
            iVar10 = pVVar12[lVar13].pArray[lVar23];
            lVar36 = (long)iVar10;
            if ((lVar36 < 0) || (pGVar9->nObjs <= iVar10)) goto LAB_007a5be3;
            uVar11 = pGVar9->pObjs[lVar36].Value;
            iVar2 = p->vLeaves->nSize;
            if (iVar2 <= (int)uVar11) {
              if (iVar17 <= iVar10) goto LAB_007a5c02;
              if (pVVar12[lVar36].nSize == 0) {
                __assert_fail("(int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                              ,0x32a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
              }
            }
            if (uVar11 != 0xffffffff) {
              if ((int)uVar11 < iVar2) {
                if ((int)uVar11 < 0x40) {
                  wVar28 = wVar28 | 1L << ((ulong)uVar11 & 0x3f);
                }
                else {
                  uVar16 = uVar16 | 1L << ((ulong)(byte)((char)uVar11 - 0x40) & 0x3f);
                }
              }
              else {
                uVar11 = uVar11 - iVar2;
                if (uVar11 < 0x40) {
                  uVar15 = uVar15 | 1L << ((ulong)uVar11 & 0x3f);
                }
                else {
                  uVar20 = uVar20 | 1L << ((ulong)(byte)((char)uVar11 - 0x40) & 0x3f);
                }
              }
            }
            lVar23 = lVar23 + 1;
          } while (pVVar12[lVar13].nSize != lVar23);
        }
        uVar11 = p->vLeaves->nSize + iVar14;
        if ((((int)uVar11 < 0) || (p->vCutsStart->nSize <= (int)uVar11)) ||
           (p->vCutsNum->nSize <= (int)uVar11)) {
LAB_007a5c21:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar13 = (long)p->vCutsNum->pArray[uVar11];
        iVar10 = -1;
        if (0 < lVar13) {
          lVar23 = (long)p->vCutsStart->pArray[uVar11];
          lVar13 = lVar13 + lVar23;
          do {
            if (((p->vCutsI1->pArray[lVar23] == wVar28) && (p->vCutsI2->pArray[lVar23] == uVar16))
               && ((p->vCutsN1->pArray[lVar23] == uVar15 && (p->vCutsN2->pArray[lVar23] == uVar20)))
               ) {
              iVar10 = (int)lVar23;
              break;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < lVar13);
        }
        if (-1 < iVar10) {
          Vec_IntPush(p->vPolar,iVar10 + p->FirstVar);
        }
      }
      lVar18 = lVar18 + 1;
      pVVar12 = p->vAnds;
      uVar11 = pVVar12->nSize;
      uVar20 = (ulong)(int)uVar11;
    } while (lVar18 < (long)uVar20);
  }
  lVar18 = (long)p->vLeaves->nSize;
  if (0 < lVar18) {
    pGVar9 = p->pGia;
    piVar6 = p->vLeaves->pArray;
    lVar13 = 0;
    do {
      iVar10 = piVar6[lVar13];
      if (((long)iVar10 < 0) || (pGVar9->nObjs <= iVar10)) goto LAB_007a5be3;
      pGVar5 = pGVar9->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar5[iVar10].Value = 0xffffffff;
      lVar13 = lVar13 + 1;
    } while (lVar18 != lVar13);
  }
  if (0 < (int)uVar11) {
    pGVar9 = p->pGia;
    piVar6 = pVVar12->pArray;
    uVar20 = 0;
    do {
      iVar10 = piVar6[uVar20];
      if (((long)iVar10 < 0) || (pGVar9->nObjs <= iVar10)) {
LAB_007a5be3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = pGVar9->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar5[iVar10].Value = 0xffffffff;
      uVar20 = uVar20 + 1;
    } while (uVar11 != uVar20);
  }
  iVar10 = clock_gettime(3,&local_80);
  if (iVar10 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  p->timeCut = p->timeCut + lVar18 + local_a0;
  return p->vCutsI1->nSize;
}

Assistant:

int Sbl_ManComputeCuts( Sbl_Man_t * p )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; Vec_Int_t * vFanins;
    int i, k, Index, Fanin, nObjs = Vec_IntSize(p->vLeaves) + Vec_IntSize(p->vAnds);
    assert( Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars );
    // assign leaf cuts
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vCutsNum );
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
    {
        Vec_IntPush( p->vCutsStart, Vec_WrdSize(p->vCutsI1) );
        Vec_IntPush( p->vCutsObj, -1 );
        Vec_IntPush( p->vCutsNum, 1 );
        if ( i < 64 )
        {
            Vec_WrdPush( p->vCutsI1, (((word)1) << i) );
            Vec_WrdPush( p->vCutsI2, 0 );
        }
        else
        {
            Vec_WrdPush( p->vCutsI1, 0 );
            Vec_WrdPush( p->vCutsI2, (((word)1) << (i-64)) );
        }
        Vec_WrdPush( p->vCutsN1, 0 );
        Vec_WrdPush( p->vCutsN2, 0 );
        pObj->Value = i;
    }
    // assign internal cuts
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        assert( ~Gia_ObjFanin0(pObj)->Value );
        assert( ~Gia_ObjFanin1(pObj)->Value );
        Sbl_ManComputeCutsOne( p, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, i );
        pObj->Value = Vec_IntSize(p->vLeaves) + i;
    }
    assert( Vec_IntSize(p->vCutsStart) == nObjs );
    assert( Vec_IntSize(p->vCutsNum)   == nObjs );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_WrdSize(p->vCutsN1) );
    assert( Vec_WrdSize(p->vCutsI2)    == Vec_WrdSize(p->vCutsN2) );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_IntSize(p->vCutsObj) );
    // check that roots are mapped nodes
    Vec_IntClear( p->vRootVars );
    Gia_ManForEachObjVec( p->vRoots, p->pGia, pObj, i )
    {
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsLut2(p->pGia, Obj) );
        assert( ~pObj->Value );
        Vec_IntPush( p->vRootVars, pObj->Value - Vec_IntSize(p->vLeaves) );
    }
    // create current solution
    Vec_IntClear( p->vPolar );
    Vec_IntClear( p->vSolInit );
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        word CutI1 = 0, CutI2 = 0, CutN1 = 0, CutN2 = 0;
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( !Gia_ObjIsLut2(p->pGia, Obj) )
            continue;
        assert( (int)pObj->Value == Vec_IntSize(p->vLeaves) + i );
        // add node
        Vec_IntPush( p->vPolar, i );
        Vec_IntPush( p->vSolInit, i );
        // add its cut
        //Gia_LutForEachFaninObj( p->pGia, Obj, pFanin, k )
        vFanins = Gia_ObjLutFanins2( p->pGia, Obj );
        Vec_IntForEachEntry( vFanins, Fanin, k )
        {
            Gia_Obj_t * pFanin = Gia_ManObj( p->pGia, Fanin );
            assert( (int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin) );
//            if ( ~pFanin->Value == 0 )
//                Gia_ManPrintConeMulti( p->pGia, p->vAnds, p->vLeaves, p->vPath );
            if ( ~pFanin->Value == 0 ) 
                continue;
            assert( ~pFanin->Value );
            if ( (int)pFanin->Value < Vec_IntSize(p->vLeaves) )
            {
                if ( (int)pFanin->Value < 64 )
                    CutI1 |= ((word)1 << pFanin->Value);
                else
                    CutI2 |= ((word)1 << (pFanin->Value - 64));
            }
            else
            {
                if ( pFanin->Value - Vec_IntSize(p->vLeaves) < 64 )
                    CutN1 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves)));
                else
                    CutN2 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves) - 64));
            }
        }
        // find the new cut
        Index = Sbl_ManFindCut( p, Vec_IntSize(p->vLeaves) + i, CutI1, CutI2, CutN1, CutN2 );
        if ( Index < 0 )
        {
            //printf( "Cannot find the available cut.\n" );
            continue;
        }
        assert( Index >= 0 );
        Vec_IntPush( p->vPolar, p->FirstVar+Index );
    }
    // clean value
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
        pObj->Value = ~0;
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
        pObj->Value = ~0;
    p->timeCut += Abc_Clock() - clk;
    return Vec_WrdSize(p->vCutsI1);
}